

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArray.h
# Opt level: O0

void __thiscall
pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>>::
pushBack<pica::Particle<(pica::Dimension)1>>
          (ParticleArraySoA<pica::Particle<(pica::Dimension)1>_> *this,
          Particle<(pica::Dimension)1> particle)

{
  value_type *__x;
  vector<double,_std::allocator<double>_> *this_00;
  long in_RDI;
  int d_1;
  MomentumType p;
  int d;
  PositionType position;
  value_type *in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  int local_3c;
  MomentumType local_38;
  double local_20;
  int local_14;
  Vector1<double> local_10 [2];
  
  local_10[0].x =
       (double)Particle<(pica::Dimension)1>::getPosition
                         ((Particle<(pica::Dimension)1> *)&stack0x00000008);
  for (local_14 = 0; local_14 < 1; local_14 = local_14 + 1) {
    local_20 = Vector1<double>::operator[](local_10,local_14);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  Particle<(pica::Dimension)1>::getP(&local_38,(Particle<(pica::Dimension)1> *)&stack0x00000008);
  for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
    Vector3<double>::operator[](&local_38,local_3c);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  __x = (value_type *)(in_RDI + 0x60);
  Particle<(pica::Dimension)1>::getFactor((Particle<(pica::Dimension)1> *)&stack0x00000008);
  std::vector<double,_std::allocator<double>_>::push_back(in_stack_ffffffffffffff70,__x);
  this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x78);
  Particle<(pica::Dimension)1>::getGamma((Particle<(pica::Dimension)1> *)&stack0x00000008);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,__x);
  Particle<(pica::Dimension)1>::getType((Particle<(pica::Dimension)1> *)&stack0x00000008);
  std::vector<short,_std::allocator<short>_>::push_back
            ((vector<short,_std::allocator<short>_> *)this_00,(value_type_conflict2 *)__x);
  return;
}

Assistant:

void pushBack(ConstParticleRefType particle)
    {
        const typename ParticleRef::PositionType position = particle.getPosition();
        for (int d = 0; d < ParticleRef::dimension; d++)
            positions[d].push_back(position[d]);
        const typename ParticleRef::MomentumType p = particle.getP();
        for (int d = 0; d < ParticleRef::momentumDimension; d++)
            ps[d].push_back(p[d]);
        factors.push_back(particle.getFactor());
        invGammas.push_back(static_cast<typename ParticleRef::GammaType>(1.0) / particle.getGamma());
        typeIndex.push_back(particle.getType());
    }